

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

void XUtf8DrawImageString
               (Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,char *string
               ,int num_bytes)

{
  unsigned_long uVar1;
  int iVar2;
  XGCValues xgcv;
  
  iVar2 = XUtf8TextWidth(font_set,string,num_bytes);
  XGetGCValues(display,gc,0x10d,&xgcv);
  uVar1 = xgcv.foreground;
  xgcv.function = 3;
  xgcv.foreground = xgcv.background;
  xgcv.background = uVar1;
  xgcv.fill_style = 0;
  XChangeGC(display,gc,0x10d,&xgcv);
  XFillRectangle(display,d,gc,x,y - font_set->ascent,iVar2,font_set->ascent + font_set->descent);
  XChangeGC(display,gc,0x10d,&xgcv);
  XUtf8DrawString(display,d,font_set,gc,x,y,string,num_bytes);
  return;
}

Assistant:

void
XUtf8DrawImageString(Display         *display,
		     Drawable        d,
		     XUtf8FontStruct *font_set,
		     GC              gc,
		     int             x,
		     int             y,
		     const char      *string,
		     int             num_bytes) {

  /* FIXME: must be improved ! */
  int w;
  int fill_style;
  unsigned long foreground;
  unsigned long background;
  int function;
  XGCValues xgcv;

  w = XUtf8TextWidth(font_set, string, num_bytes);

  XGetGCValues(display, gc,
	       GCFunction|GCForeground|GCBackground|GCFillStyle, &xgcv);

  function = xgcv.function;
  fill_style = xgcv.fill_style;
  foreground = xgcv.foreground;
  background = xgcv.background;

  xgcv.function = GXcopy;
  xgcv.foreground = background;
  xgcv.background = foreground;
  xgcv.fill_style = FillSolid;

  XChangeGC(display, gc,
	    GCFunction|GCForeground|GCBackground|GCFillStyle, &xgcv);

  XFillRectangle(display, d, gc, x, y - font_set->ascent,
	         (unsigned)w, (unsigned)(font_set->ascent + font_set->descent));

  xgcv.function = function;
  xgcv.foreground = foreground;
  xgcv.background = background;
  xgcv.fill_style = fill_style;

  XChangeGC(display, gc,
	    GCFunction|GCForeground|GCBackground|GCFillStyle, &xgcv);

  XUtf8DrawString(display, d, font_set, gc, x, y, string, num_bytes);
}